

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macros.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Disa::console_format_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Disa *this,Log_Level level,source_location *location)

{
  undefined8 *puVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint __val;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> suffix;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = *(undefined8 **)CONCAT71(in_register_00000011,level);
  if (puVar1 == (undefined8 *)0x0) {
    pcVar14 = "";
  }
  else {
    pcVar14 = (char *)*puVar1;
  }
  sVar7 = strlen(pcVar14);
  if (sVar7 == 0) {
LAB_0010ddb2:
    __pos = 0;
  }
  else {
    sVar8 = sVar7 + 1;
    do {
      if (sVar8 == 1) goto LAB_0010ddb2;
      __pos = sVar8 - 1;
      lVar2 = sVar8 - 2;
      sVar8 = __pos;
    } while (pcVar14[lVar2] != '/');
  }
  if (puVar1 == (undefined8 *)0x0) {
    pcVar14 = "";
  }
  else {
    pcVar14 = (char *)*puVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar14,&local_d1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_70,&local_50,__pos,0xffffffffffffffff);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"::");
  paVar12 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar10) {
    local_b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  lVar2 = *(long *)CONCAT71(in_register_00000011,level);
  if (lVar2 == 0) {
    __val = 0;
  }
  else {
    __val = *(uint *)(lVar2 + 0x10);
  }
  uVar6 = 1;
  if (9 < __val) {
    uVar15 = (ulong)__val;
    uVar5 = 4;
    do {
      uVar6 = uVar5;
      uVar13 = (uint)uVar15;
      if (uVar13 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_0010deb3;
      }
      if (uVar13 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_0010deb3;
      }
      if (uVar13 < 10000) goto LAB_0010deb3;
      uVar15 = uVar15 / 10000;
      uVar5 = uVar6 + 4;
    } while (99999 < uVar13);
    uVar6 = uVar6 + 1;
  }
LAB_0010deb3:
  paVar10 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,(ulong)uVar6,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,__val);
  uVar15 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
           local_b0._M_string_length;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar12) {
    uVar16 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < uVar15) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar10) {
      uVar16 = local_90.field_2._M_allocated_capacity;
    }
    if (uVar15 <= (ulong)uVar16) {
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_0010df37;
    }
  }
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_90._M_dataplus._M_p,
                     CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
LAB_0010df37:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if (paVar3 == paVar11) {
    local_f8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar3;
  }
  local_f8._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,"]: ");
  local_d0 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0 == paVar11) {
    local_c0 = paVar11->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = paVar11->_M_allocated_capacity;
  }
  local_c8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  paVar11 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar11) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar10) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar12) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  switch((ulong)this & 0xff) {
  case 0:
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,"[Error|",7);
    break;
  case 1:
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,"[Warn |",7);
    break;
  case 2:
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,"[Info |",7);
    break;
  case 3:
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,"[Debug|",7);
    break;
  default:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d0,(pointer)(local_c8 + (long)local_d0));
    std::operator+(&local_b0,"[Error|",&local_70);
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b0," Unrecognised log level parsed.");
    local_f8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar12 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar12) {
      local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_f8._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_f8._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    exit(1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (pbVar9->_M_dataplus)._M_p;
  paVar12 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar12) {
    uVar16 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar16;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar11) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<char> console_format(const Log_Level level, const std::source_location& location) {
  auto const iter = std::basic_string_view<char>(location.file_name()).find_last_of('/');
  const auto suffix =
  std::basic_string<char>(location.file_name()).substr(iter + 1) + "::" + std::to_string(location.line()) + "]: ";
  switch(level) {
    case Log_Level::Debug:
      return "[Debug|" + std::basic_string(suffix);
    case Log_Level::Info:
      return "[Info |" + std::basic_string(suffix);
    case Log_Level::Warning:
      return "[Warn |" + std::basic_string(suffix);
    case Log_Level::Error:
      return "[Error|" + std::basic_string(suffix);
    default:
      std::cout << "[Error|" + std::basic_string(suffix) + " Unrecognised log level parsed.";
      exit(1);
  }
}